

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O3

void anon_unknown.dwarf_c94a2::traversePrePost
               (Ref node,function<void_(cashew::Ref)> *visitPre,
               function<void_(cashew::Ref)> *visitPost)

{
  Value *pVVar1;
  pointer pRVar2;
  Ref RVar3;
  pointer pTVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong uVar7;
  pointer pRVar8;
  Ref RVar9;
  pointer this;
  pointer pTVar10;
  ulong uVar11;
  _Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  *this_00;
  TraverseInfo local_a8;
  pointer local_80;
  _Any_data *local_78;
  _Any_data *local_70;
  Ref local_68;
  pointer local_60;
  vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  local_58;
  pointer local_38;
  
  local_58.
  super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = (_Any_data *)visitPre;
  TraverseInfo::TraverseInfo(&local_a8,node);
  local_70 = (_Any_data *)visitPost;
  pTVar4 = std::
           _Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
           ::_M_allocate((_Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                          *)0x1,(size_t)node.inst);
  pTVar4->scanned = local_a8.scanned;
  (pTVar4->node).inst = local_a8.node.inst;
  (pTVar4->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_a8.children.super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
       super__Vector_impl_data._M_start;
  (pTVar4->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_a8.children.super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (pTVar4->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_a8.children.super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_60 = pTVar4 + 1;
  pTVar10 = local_60;
  local_58.
  super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = pTVar4;
  local_58.
  super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = local_60;
  local_58.
  super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_60;
  do {
    if (pTVar10[-1].scanned == false) {
      pTVar10[-1].scanned = true;
      local_a8.node.inst = pTVar10[-1].node.inst;
      if (*(long *)(local_78 + 1) == 0) goto LAB_0014c395;
      (**(code **)(local_78->_M_pod_data + 0x18))(local_78,&local_a8.node);
      pRVar8 = pTVar10[-1].children.super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_80 = pTVar10[-1].children.super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      local_38 = local_58.
                 super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      this = local_58.
             super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
      if (pRVar8 != local_80) {
        do {
          RVar9.inst = pRVar8->inst;
          if (this == local_60) {
            uVar11 = (long)this - (long)local_38;
            if (uVar11 == 0x7ffffffffffffff8) {
              local_58.
              super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = local_60;
              local_58.
              super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
              ._M_impl.super__Vector_impl_data._M_start = local_38;
              local_58.
              super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish = this;
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar5 = ((long)uVar11 >> 3) * -0x3333333333333333;
            uVar7 = uVar5;
            if (this == local_38) {
              uVar7 = 1;
            }
            this_00 = (_Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                       *)(uVar7 + uVar5);
            if ((_Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                 *)0x333333333333332 < this_00) {
              this_00 = (_Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                         *)0x333333333333333;
            }
            if (CARRY8(uVar7,uVar5)) {
              this_00 = (_Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                         *)0x333333333333333;
            }
            local_68.inst = RVar9.inst;
            pTVar4 = std::
                     _Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                     ::_M_allocate(this_00,(size_t)RVar9.inst);
            RVar9.inst = local_68.inst;
            local_68.inst = (Value *)pTVar4;
            TraverseInfo::TraverseInfo((TraverseInfo *)((long)pTVar4 + uVar11),RVar9);
            RVar3.inst = local_68.inst;
            RVar9.inst = local_68.inst;
            for (pTVar4 = local_38; this != pTVar4; pTVar4 = pTVar4 + 1) {
              ((pointer)RVar9.inst)->scanned = pTVar4->scanned;
              (((pointer)RVar9.inst)->node).inst = (pTVar4->node).inst;
              pRVar2 = (pTVar4->children).
                       super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              (((pointer)RVar9.inst)->children).
              super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pTVar4->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              (((pointer)RVar9.inst)->children).
              super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish = pRVar2;
              (((pointer)RVar9.inst)->children).
              super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pTVar4->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
              (pTVar4->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (pTVar4->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (pTVar4->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              RVar9.inst = RVar9.inst + 0x28;
            }
            if (local_38 != (pointer)0x0) {
              operator_delete(local_38,uVar11);
            }
            local_60 = (pointer)((long)RVar3.inst + this_00 * 0x28);
            local_38 = (pointer)RVar3.inst;
          }
          else {
            TraverseInfo::TraverseInfo(this,RVar9);
            RVar9.inst = (Value *)this;
          }
          this = (pointer)((long)RVar9.inst + 0x28);
          pRVar8 = pRVar8 + 1;
        } while (pRVar8 != local_80);
      }
      local_58.
      super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_60;
      local_58.
      super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = local_38;
      pTVar4 = local_38;
      local_58.
      super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = this;
    }
    else {
      this = pTVar10 + -1;
      pVVar1 = pTVar10[-1].node.inst;
      pRVar8 = pTVar10[-1].children.super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_58.
      super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = this;
      if (pRVar8 != (pointer)0x0) {
        operator_delete(pRVar8,(long)pTVar10[-1].children.
                                     super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pRVar8);
      }
      local_a8.node.inst = pVVar1;
      if (*(long *)(local_70 + 1) == 0) {
        std::__throw_bad_function_call();
LAB_0014c395:
        uVar6 = std::__throw_bad_function_call();
        if (local_a8.children.super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.children.
                          super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_a8.children.
                                super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_a8.children.
                                super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
        ::~vector(&local_58);
        _Unwind_Resume(uVar6);
      }
      (**(code **)(local_70->_M_pod_data + 0x18))(local_70,&local_a8.node);
    }
    pTVar10 = this;
    if (pTVar4 == this) {
      std::
      vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
      ::~vector(&local_58);
      return;
    }
  } while( true );
}

Assistant:

static void traversePrePost(Ref node,
                            std::function<void(Ref)> visitPre,
                            std::function<void(Ref)> visitPost) {
  std::vector<TraverseInfo> stack;
  stack.push_back(TraverseInfo(node));
  while (!stack.empty()) {
    TraverseInfo& back = stack.back();
    if (!back.scanned) {
      back.scanned = true;
      // This is the first time we see this.
      visitPre(back.node);
      for (auto child : back.children) {
        stack.emplace_back(child);
      }
      continue;
    }
    // Time to post-visit the node itself
    auto node = back.node;
    stack.pop_back();
    visitPost(node);
  }
}